

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

void Image_Function::Split
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out1,uint32_t startXOut1,
               uint32_t startYOut1,Image *out2,uint32_t startXOut2,uint32_t startYOut2,Image *out3,
               uint32_t startXOut3,uint32_t startYOut3,uint32_t width,uint32_t height)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uchar *puVar5;
  uchar *puVar6;
  uchar *puVar7;
  uchar *puVar8;
  uchar *puVar9;
  ImageTemplate<unsigned_char> *in_RCX;
  uchar *puVar10;
  int in_EDX;
  int in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint in_R8D;
  int in_R9D;
  ImageTemplate<unsigned_char> *in_stack_00000008;
  uint in_stack_00000010;
  int in_stack_00000018;
  ImageTemplate<unsigned_char> *in_stack_00000020;
  uint in_stack_00000028;
  uint8_t *inXEnd;
  uint8_t *out3X;
  uint8_t *out2X;
  uint8_t *out1X;
  uint8_t *inX;
  uint8_t *inYEnd;
  uint8_t *out3Y;
  uint8_t *out2Y;
  uint8_t *out1Y;
  uint8_t *inY;
  uint32_t rowSizeOut3;
  uint32_t rowSizeOut2;
  uint32_t rowSizeOut1;
  uint32_t rowSizeIn;
  uint8_t colorCount;
  ImageTemplate<unsigned_char> *image;
  uint uVar11;
  undefined4 in_stack_fffffffffffffee4;
  uint32_t in_stack_fffffffffffffef0;
  int iVar12;
  uint32_t in_stack_fffffffffffffef4;
  uint32_t in_stack_fffffffffffffef8;
  uint32_t in_stack_fffffffffffffefc;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff10;
  uchar *puVar13;
  undefined8 in_stack_ffffffffffffff18;
  uchar *puVar14;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff20;
  uchar *puVar15;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff28;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff30;
  uint32_t in_stack_ffffffffffffff38;
  uint32_t in_stack_ffffffffffffff40;
  uint32_t in_stack_ffffffffffffff48;
  uint32_t in_stack_ffffffffffffff50;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
             in_stack_fffffffffffffef4,in_stack_fffffffffffffef0);
  image = in_stack_00000020;
  uVar11 = in_stack_00000028;
  iVar12 = (int)out3X;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff20,(uint32_t)((ulong)in_stack_ffffffffffffff18 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
             (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff08,in_stack_ffffffffffffff30,in_stack_ffffffffffffff38
             ,in_stack_ffffffffffffff40,in_stack_ffffffffffffff48,in_stack_ffffffffffffff50);
  VerifyRGBImage<PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffef4,iVar12));
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffee4,uVar11),image);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffee4,uVar11),image);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x121bd9);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x121be6);
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RCX);
  uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_stack_00000008);
  uVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_stack_00000020);
  puVar5 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
  puVar5 = puVar5 + (ulong)(uint)(in_ESI * 3) + (ulong)(in_EDX * uVar1);
  puVar6 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RCX);
  puVar6 = puVar6 + (ulong)in_R8D + (ulong)(in_R9D * uVar2);
  puVar7 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_stack_00000008);
  puVar7 = puVar7 + (ulong)in_stack_00000010 + (ulong)(in_stack_00000018 * uVar3);
  puVar8 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_stack_00000020);
  puVar8 = puVar8 + (ulong)in_stack_00000028 + (ulong)((int)inXEnd * uVar4);
  puVar9 = puVar5 + (int)out2X * uVar1;
  for (; puVar5 != puVar9; puVar5 = puVar5 + uVar1) {
    puVar13 = puVar8;
    puVar14 = puVar7;
    puVar15 = puVar6;
    for (puVar10 = puVar5; puVar10 != puVar5 + (uint)((int)out3X * 3); puVar10 = puVar10 + 3) {
      *puVar15 = *puVar10;
      *puVar14 = puVar10[1];
      *puVar13 = puVar10[2];
      puVar13 = puVar13 + 1;
      puVar14 = puVar14 + 1;
      puVar15 = puVar15 + 1;
    }
    puVar6 = puVar6 + uVar2;
    puVar7 = puVar7 + uVar3;
    puVar8 = puVar8 + uVar4;
  }
  return;
}

Assistant:

void Split( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out1, uint32_t startXOut1, uint32_t startYOut1,
                Image & out2, uint32_t startXOut2, uint32_t startYOut2, Image & out3, uint32_t startXOut3, uint32_t startYOut3,
                uint32_t width, uint32_t height )
    {
        ParameterValidation ( in, startXIn, startYIn, width, height );
        ParameterValidation ( out1, startXOut1, startYOut1, out2, startXOut2, startYOut2, out3, startXOut3, startYOut3, width, height );
        VerifyRGBImage      ( in );
        VerifyGrayScaleImage( out1, out2, out3 );

        const uint8_t colorCount = RGB;

        const uint32_t rowSizeIn   = in.rowSize();
        const uint32_t rowSizeOut1 = out1.rowSize();
        const uint32_t rowSizeOut2 = out2.rowSize();
        const uint32_t rowSizeOut3 = out3.rowSize();

        width = width * colorCount;

        const uint8_t * inY = in.data() + startYIn * rowSizeIn + startXIn * colorCount;
        uint8_t * out1Y = out1.data() + startYOut1 * rowSizeOut1 + startXOut1;
        uint8_t * out2Y = out2.data() + startYOut2 * rowSizeOut2 + startXOut2;
        uint8_t * out3Y = out3.data() + startYOut3 * rowSizeOut3 + startXOut3;

        const uint8_t * inYEnd = inY + height * rowSizeIn;

        for( ; inY != inYEnd; inY += rowSizeIn, out1Y += rowSizeOut1, out2Y += rowSizeOut2, out3Y += rowSizeOut3 ) {
            const uint8_t * inX = inY;
            uint8_t * out1X = out1Y;
            uint8_t * out2X = out2Y;
            uint8_t * out3X = out3Y;

            const uint8_t * inXEnd = inX + width;

            for( ; inX != inXEnd; ) {
                *(out1X++) = *(inX++);
                *(out2X++) = *(inX++);
                *(out3X++) = *(inX++);
            }
        }
    }